

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_map.hpp
# Opt level: O2

void run<std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,unsigned_int,double>
               (vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                *A,vector<unsigned_int,_std::allocator<unsigned_int>_> *B_rows,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *B_cols,
               vector<double,_std::allocator<double>_> *B_values)

{
  pointer puVar1;
  uint uVar2;
  _Rb_tree_color _Var3;
  pointer pmVar4;
  pointer puVar5;
  pointer pmVar6;
  pointer puVar7;
  pointer pdVar8;
  long lVar9;
  _Rb_tree_node_base *p_Var10;
  size_t *psVar11;
  uint uVar12;
  size_t row_2;
  size_t row;
  long lVar13;
  size_type __new_size;
  bool bVar14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> B_offsets;
  
  pmVar4 = (A->
           super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar9 = ((long)(A->
                 super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar4) / 0x30;
  psVar11 = (size_t *)((long)&(pmVar4->_M_t)._M_impl.super__Rb_tree_header + 0x20);
  __new_size = 0;
  while (bVar14 = lVar9 != 0, lVar9 = lVar9 + -1, bVar14) {
    __new_size = __new_size + *psVar11;
    psVar11 = psVar11 + 6;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(B_cols,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(B_values,__new_size);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (B_rows,((long)(A->
                           super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(A->
                          super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) / 0x30 + 1);
  pmVar4 = (A->
           super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar9 = ((long)(A->
                 super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar4) / 0x30;
  for (lVar13 = 0; lVar13 != lVar9; lVar13 = lVar13 + 1) {
    puVar5 = (B_rows->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (p_Var10 = *(_Base_ptr *)((long)&pmVar4[lVar13]._M_t._M_impl.super__Rb_tree_header + 0x10);
        p_Var10 != &pmVar4[lVar13]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
      puVar7 = puVar5 + p_Var10[1]._M_color;
      *puVar7 = *puVar7 + 1;
    }
  }
  puVar5 = (B_rows->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = 0;
  for (lVar13 = 0; lVar9 != lVar13; lVar13 = lVar13 + 1) {
    uVar2 = puVar5[lVar13];
    puVar5[lVar13] = uVar12;
    uVar12 = uVar2 + uVar12;
  }
  (B_rows->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start[lVar9] = uVar12;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&B_offsets,B_rows);
  pmVar4 = (A->
           super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pmVar6 = (A->
           super__Vector_base<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (lVar9 = 0;
      puVar5 = B_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start, lVar9 != ((long)pmVar6 - (long)pmVar4) / 0x30;
      lVar9 = lVar9 + 1) {
    puVar7 = (B_cols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (B_values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (p_Var10 = *(_Base_ptr *)((long)&pmVar4[lVar9]._M_t._M_impl.super__Rb_tree_header + 0x10);
        p_Var10 != &pmVar4[lVar9]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
      _Var3 = p_Var10[1]._M_color;
      uVar12 = puVar5[_Var3];
      puVar7[uVar12] = (uint)lVar9;
      pdVar8[uVar12] = (double)p_Var10[1]._M_parent;
      puVar1 = puVar5 + _Var3;
      *puVar1 = *puVar1 + 1;
    }
  }
  do_nothing(B_rows,B_cols,B_values);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&B_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void run(std::vector<RowT> const & A,
         std::vector<IndexT> & B_rows,
         std::vector<IndexT> & B_cols,
         std::vector<NumericT> & B_values)
{
  std::size_t B_nnz = 0;

  for (std::size_t i = 0; i < A.size(); ++i)
    B_nnz += A[i].size();

  // initialize datastructures for B:
  B_cols.resize(B_nnz);    // note: initialization with zero not strictly required
  B_values.resize(B_nnz);  // note: initialization with zero not strictly required
  B_rows.resize(A.size() + 1);

  //
  // Stage 1: Compute nonzero pattern for B
  //
  for (std::size_t row = 0; row < A.size(); ++row)
  {
    for (typename RowT::const_iterator it = A[row].begin(); it != A[row].end(); ++it)
      B_rows[it->first] += 1;
  }

  // Bring row-start array in place using exclusive-scan:
  IndexT offset = 0;
  for (std::size_t row = 0; row < A.size(); ++row)
  {
    IndexT tmp = B_rows[row];
    B_rows[row] = offset;
    offset += tmp;
  }
  B_rows[A.size()] = offset;


  //
  // Stage 2: Fill with data
  //
  std::vector<IndexT> B_offsets(B_rows); // index of first unwritten element per row

  for (std::size_t row = 0; row < A.size(); ++row)
  {
    for (typename RowT::const_iterator it = A[row].begin(); it != A[row].end(); ++it)
    {
      IndexT col_in_A = it->first;
      IndexT B_nnz_index = B_offsets[col_in_A];
      B_cols[B_nnz_index] = row;
      B_values[B_nnz_index] = it->second;
      B_offsets[col_in_A] += 1;
    }
  }

  do_nothing(B_rows, B_cols, B_values);
}